

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O3

void __thiscall Js::DebugManager::ValidateDebugAPICall(DebugManager *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  void **ppvVar4;
  undefined4 *puVar5;
  void **ppvVar6;
  undefined1 local_d0 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *javascriptFunction;
  
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_d0,this->pThreadContext->entryExitRecord->scriptContext,
             true,(PVOID)0x0,false);
  walker.currentFrame.stackCheckCodeHeight = 0;
  BVar3 = JavascriptStackWalker::GetCaller
                    ((JavascriptStackWalker *)local_d0,
                     (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
  if ((BVar3 != 0) && (walker.currentFrame.stackCheckCodeHeight != 0)) {
    ppvVar4 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_d0);
    ppvVar6 = (void **)this->dispatchHaltFrameAddress;
    if (ppvVar6 == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                  ,0xcb,"(this->dispatchHaltFrameAddress != nullptr)",
                                  "this->dispatchHaltFrameAddress != nullptr");
      if (!bVar2) goto LAB_008aa0f0;
      *puVar5 = 0;
      ppvVar6 = (void **)this->dispatchHaltFrameAddress;
    }
    if (ppvVar4 < ppvVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                  ,0xcf,"(false)",
                                  "There are JavaScript frames between current API and dispatch halt"
                                 );
      if (!bVar2) {
LAB_008aa0f0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_d0);
  return;
}

Assistant:

void DebugManager::ValidateDebugAPICall()
    {
        Js::JavascriptStackWalker walker(this->pThreadContext->GetScriptEntryExit()->scriptContext);
        Js::JavascriptFunction* javascriptFunction = nullptr;
        if (walker.GetCaller(&javascriptFunction))
        {
            if (javascriptFunction != nullptr)
            {
                void *topJsFrameAddr = (void *)walker.GetCurrentArgv();
                Assert(this->dispatchHaltFrameAddress != nullptr);
                if (topJsFrameAddr < this->dispatchHaltFrameAddress)
                {
                    // we found the script frame after the break mode.
                    AssertMsg(false, "There are JavaScript frames between current API and dispatch halt");
                }
            }
        }
    }